

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Getters.h
# Opt level: O2

GameState __thiscall libchess::Position::game_state(Position *this)

{
  bool bVar1;
  GameState GVar2;
  MoveList move_list;
  
  bVar1 = is_repeat(this,2);
  if (bVar1) {
    GVar2 = THREEFOLD_REPETITION;
  }
  else if ((this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start[this->ply_].halfmoves_ < 100) {
    legal_move_list(&move_list,this);
    GVar2 = IN_PROGRESS;
    if (move_list.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        move_list.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar1 = in_check(this);
      GVar2 = STALEMATE - bVar1;
    }
    std::_Vector_base<libchess::Move,_std::allocator<libchess::Move>_>::~_Vector_base
              ((_Vector_base<libchess::Move,_std::allocator<libchess::Move>_> *)&move_list);
  }
  else {
    GVar2 = FIFTY_MOVES;
  }
  return GVar2;
}

Assistant:

inline Position::GameState Position::game_state() const {
    if (is_repeat(2)) {
        return GameState::THREEFOLD_REPETITION;
    } else if (halfmoves() >= 100) {
        return GameState::FIFTY_MOVES;
    } else {
        MoveList move_list = legal_move_list();

        if (move_list.empty()) {
            return in_check() ? GameState::CHECKMATE : GameState::STALEMATE;
        }

        return GameState::IN_PROGRESS;
    }
}